

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O0

int mbedtls_ripemd160_self_test(int verbose)

{
  int iVar1;
  uchar local_38 [8];
  uchar output [20];
  int local_18;
  int local_14;
  int ret;
  int i;
  int verbose_local;
  
  memset(local_38,0,0x14);
  local_14 = 0;
  while( true ) {
    if (7 < local_14) {
      if (verbose != 0) {
        printf(anon_var_dwarf_8545 + 8);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  RIPEMD-160 test #%d: ",(ulong)(local_14 + 1));
    }
    local_18 = mbedtls_ripemd160_ret
                         (ripemd160_test_str[local_14],ripemd160_test_strlen[local_14],local_38);
    if (local_18 != 0) break;
    iVar1 = memcmp(local_38,ripemd160_test_md + local_14,0x14);
    if (iVar1 != 0) {
      local_18 = 1;
      break;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    local_14 = local_14 + 1;
  }
  if (verbose != 0) {
    printf("failed\n");
  }
  return local_18;
}

Assistant:

int mbedtls_ripemd160_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char output[20];

    memset( output, 0, sizeof output );

    for( i = 0; i < TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  RIPEMD-160 test #%d: ", i + 1 );

        ret = mbedtls_ripemd160_ret( ripemd160_test_str[i],
                                     ripemd160_test_strlen[i], output );
        if( ret != 0 )
            goto fail;

        if( memcmp( output, ripemd160_test_md[i], 20 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

    return( ret );
}